

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradf2(int ido,int l1,float *cc,float *ch,float *wa1)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  
  iVar10 = l1 * ido;
  iVar1 = ido * 2;
  lVar7 = (long)ido;
  iVar9 = 0;
  if (l1 < 1) {
    l1 = 0;
  }
  pfVar4 = cc;
  iVar8 = l1;
  while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
    ch[iVar9] = *pfVar4 + pfVar4[iVar10];
    iVar9 = iVar9 + iVar1;
    ch[(long)iVar9 + -1] = *pfVar4 - pfVar4[iVar10];
    pfVar4 = pfVar4 + lVar7;
  }
  if (1 < ido) {
    if (ido == 2) {
      uVar5 = 2;
    }
    else {
      uVar5 = (ulong)(uint)ido;
      pfVar4 = cc + iVar10;
      uVar6 = 0;
      pfVar3 = cc;
      iVar9 = iVar1;
      for (iVar8 = 0; iVar8 != l1; iVar8 = iVar8 + 1) {
        pfVar2 = ch + (long)iVar9 + -2;
        for (lVar11 = 2; lVar11 < lVar7; lVar11 = lVar11 + 2) {
          fVar14 = wa1[lVar11 + -2] * pfVar4[lVar11 + -1] + wa1[lVar11 + -1] * pfVar4[lVar11];
          fVar13 = wa1[lVar11 + -2] * pfVar4[lVar11] - pfVar4[lVar11 + -1] * wa1[lVar11 + -1];
          ch[(ulong)uVar6 + lVar11] = pfVar3[lVar11] + fVar13;
          *pfVar2 = fVar13 - pfVar3[lVar11];
          ch[(ulong)uVar6 + lVar11 + -1] = pfVar3[lVar11 + -1] + fVar14;
          pfVar2[-1] = pfVar3[lVar11 + -1] - fVar14;
          pfVar2 = pfVar2 + -2;
        }
        iVar9 = iVar9 + iVar1;
        uVar6 = uVar6 + iVar1;
        pfVar3 = pfVar3 + uVar5;
        pfVar4 = pfVar4 + lVar7;
      }
      if ((ido & 1U) != 0) {
        return;
      }
    }
    pfVar4 = cc + (ido - 1);
    pfVar3 = cc + (ido + iVar10 + -1);
    pfVar2 = ch + lVar7;
    while (bVar12 = l1 != 0, l1 = l1 + -1, bVar12) {
      *pfVar2 = -*pfVar3;
      pfVar2[-1] = *pfVar4;
      pfVar4 = pfVar4 + uVar5;
      pfVar3 = pfVar3 + lVar7;
      pfVar2 = pfVar2 + iVar1;
    }
  }
  return;
}

Assistant:

static void dradf2(int ido,int l1,float *cc,float *ch,float *wa1){
  int i,k;
  float ti2,tr2;
  int t0,t1,t2,t3,t4,t5,t6;

  t1=0;
  t0=(t2=l1*ido);
  t3=ido<<1;
  for(k=0;k<l1;k++){
    ch[t1<<1]=cc[t1]+cc[t2];
    ch[(t1<<1)+t3-1]=cc[t1]-cc[t2];
    t1+=ido;
    t2+=ido;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  t2=t0;
  for(k=0;k<l1;k++){
    t3=t2;
    t4=(t1<<1)+(ido<<1);
    t5=t1;
    t6=t1+t1;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4-=2;
      t5+=2;
      t6+=2;
      tr2=wa1[i-2]*cc[t3-1]+wa1[i-1]*cc[t3];
      ti2=wa1[i-2]*cc[t3]-wa1[i-1]*cc[t3-1];
      ch[t6]=cc[t5]+ti2;
      ch[t4]=ti2-cc[t5];
      ch[t6-1]=cc[t5-1]+tr2;
      ch[t4-1]=cc[t5-1]-tr2;
    }
    t1+=ido;
    t2+=ido;
  }

  if(ido%2==1)return;

 L105:
  t3=(t2=(t1=ido)-1);
  t2+=t0;
  for(k=0;k<l1;k++){
    ch[t1]=-cc[t2];
    ch[t1-1]=cc[t3];
    t1+=ido<<1;
    t2+=ido;
    t3+=ido;
  }
}